

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTestsNamesOnly(Config *config)

{
  bool bVar1;
  int iVar2;
  TestSpecParser *this;
  IRegistryHub *pIVar3;
  undefined4 extraout_var;
  pointer this_01;
  TestCaseInfo *pTVar4;
  ostream *poVar5;
  long *in_RDI;
  TestCaseInfo *testCaseInfo;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  size_t matchedTests;
  TestSpec testSpec;
  TestSpec *in_stack_fffffffffffffe98;
  TestSpecParser *in_stack_fffffffffffffea0;
  size_t sVar6;
  TestSpecParser *in_stack_fffffffffffffea8;
  string *arg;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_108;
  undefined1 local_100 [24];
  size_t local_e8;
  undefined1 local_d9 [185];
  undefined1 local_20 [24];
  long *local_8;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this_00;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x68))();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  this = (TestSpecParser *)(**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x257ad2);
  if (!bVar1) {
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              (in_stack_fffffffffffffea0,(ITagAliasRegistry *)in_stack_fffffffffffffe98);
    arg = (string *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_d9 + 1),"*",(allocator *)arg);
    TestSpecParser::parse(this,arg);
    TestSpecParser::testSpec(in_stack_fffffffffffffea8);
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    TestSpec::~TestSpec((TestSpec *)0x257b70);
    std::__cxx11::string::~string((string *)(local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
    TestSpecParser::~TestSpecParser(in_stack_fffffffffffffea0);
  }
  local_e8 = 0;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x257c1e);
  pIVar3 = getRegistryHub();
  iVar2 = (*pIVar3->_vptr_IRegistryHub[3])();
  this_00 = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
            CONCAT44(extraout_var,iVar2);
  (**(code **)((long)&(((this_00->
                        super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                        _M_impl.super__Vector_impl_data._M_start)->super_TestCaseInfo).name.field_2
              + 8))(this_00,local_20,local_8,local_100,0);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffe98)
  ;
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffea0,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffe98);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffe98)
  ;
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffea0,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffea0,
                       (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                        *)in_stack_fffffffffffffe98);
    if (!bVar1) break;
    local_e8 = local_e8 + 1;
    this_01 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator->(&local_108);
    pTVar4 = TestCase::getTestCaseInfo(this_01);
    poVar5 = cout();
    poVar5 = std::operator<<(poVar5,(string *)pTVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_108);
  }
  sVar6 = local_e8;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(this_00);
  TestSpec::~TestSpec((TestSpec *)0x257d63);
  return sVar6;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Catch::cout() << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }